

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

long __thiscall docopt::value::asLong(value *this)

{
  long lVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  value *local_30;
  long ret;
  size_t pos;
  string *str;
  value *this_local;
  
  str = (string *)this;
  if (this->kind_ == String) {
    pos = (size_t)&this->variant_;
    local_30 = (value *)std::__cxx11::stol((string *)pos,(size_t *)&ret,10);
    lVar1 = std::__cxx11::string::length();
    if (ret != lVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pos,
                     " contains non-numeric characters.");
      std::runtime_error::runtime_error(this_00,(string *)&local_50);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local = local_30;
  }
  else {
    throwIfNotKind(this,Long);
    this_local = (value *)(this->variant_).strList.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  }
  return (long)this_local;
}

Assistant:

inline
	long value::asLong() const
	{
		// Attempt to convert a string to a long
		if (kind_ == Kind::String) {
			const std::string& str = variant_.strValue;
			std::size_t pos;
			const long ret = stol(str, &pos); // Throws if it can't convert
			if (pos != str.length()) {
				// The string ended in non-digits.
				throw std::runtime_error( str + " contains non-numeric characters.");
			}
			return ret;
		}
		throwIfNotKind(Kind::Long);
		return variant_.longValue;
	}